

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileDaily.cpp
# Opt level: O1

void __thiscall liblogger::LogFileDaily::Log(LogFileDaily *this,LogType Type,string *str)

{
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  long *plVar5;
  FILE *pFVar6;
  string *psVar7;
  ostream *poVar8;
  int *piVar9;
  char *pcVar10;
  LogException *pLVar11;
  size_type *psVar12;
  long *plVar13;
  string cname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  time_t current;
  stringstream ss;
  tm timeinfo;
  char buf [128];
  char fname [1024];
  string local_6e0;
  string local_6c0;
  long *local_6a0 [2];
  long local_690 [2];
  time_t local_680;
  long *local_678;
  long local_670;
  long local_668;
  long lStack_660;
  tm local_4f0;
  char local_4b8 [128];
  char local_438 [1032];
  
  local_680 = time((time_t *)0x0);
  localtime_r(&local_680,&local_4f0);
  sVar4 = strftime(local_438,0x400,"%Y%m%d",&local_4f0);
  if (sVar4 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_668,"strftime failed: \'",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_668,"\' error: ",9);
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<((ostream *)&local_668,pcVar10);
    pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar11,&local_6c0);
    __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
  }
  pcVar1 = (this->m_dir)._M_dataplus._M_p;
  local_6a0[0] = local_690;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_6a0,pcVar1,pcVar1 + (this->m_dir)._M_string_length);
  std::__cxx11::string::append((char *)local_6a0);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_6a0,(ulong)(this->m_prefix)._M_dataplus._M_p);
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_6e0.field_2._M_allocated_capacity = *psVar12;
    local_6e0.field_2._8_8_ = plVar5[3];
    local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  }
  else {
    local_6e0.field_2._M_allocated_capacity = *psVar12;
    local_6e0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_6e0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_6e0);
  plVar13 = plVar5 + 2;
  if ((long *)*plVar5 == plVar13) {
    local_668 = *plVar13;
    lStack_660 = plVar5[3];
    local_678 = &local_668;
  }
  else {
    local_668 = *plVar13;
    local_678 = (long *)*plVar5;
  }
  local_670 = plVar5[1];
  *plVar5 = (long)plVar13;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_678);
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  psVar12 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_6c0.field_2._M_allocated_capacity = *psVar12;
    local_6c0.field_2._8_8_ = plVar5[3];
  }
  else {
    local_6c0.field_2._M_allocated_capacity = *psVar12;
    local_6c0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_6c0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar12;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_678 != &local_668) {
    operator_delete(local_678,local_668 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if (local_6a0[0] != local_690) {
    operator_delete(local_6a0[0],local_690[0] + 1);
  }
  sVar4 = (this->m_fname)._M_string_length;
  if (sVar4 == local_6c0._M_string_length) {
    if (sVar4 == 0) goto LAB_00121fa9;
    iVar2 = bcmp((this->m_fname)._M_dataplus._M_p,local_6c0._M_dataplus._M_p,sVar4);
    if (iVar2 == 0) goto LAB_00121fa9;
  }
  if ((FILE *)this->m_fp != (FILE *)0x0) {
    iVar2 = fclose((FILE *)this->m_fp);
    if (iVar2 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_668,"Cannot close file: \'",0x14);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_668,(this->m_fname)._M_dataplus._M_p,
                          (this->m_fname)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' error: ",9);
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      std::operator<<(poVar8,pcVar10);
      pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar11,&local_6e0);
      __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
    }
    this->m_fp = (FILE *)0x0;
  }
  std::__cxx11::string::_M_assign((string *)&this->m_fname);
  RemoveOld(this);
LAB_00121fa9:
  if (this->m_fp == (FILE *)0x0) {
    pFVar6 = fopen((this->m_fname)._M_dataplus._M_p,"a");
    this->m_fp = (FILE *)pFVar6;
    if (pFVar6 == (FILE *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_668,"Cannot open file: \'",0x13);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_668,(this->m_fname)._M_dataplus._M_p,
                          (this->m_fname)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' error: ",9);
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      std::operator<<(poVar8,pcVar10);
      pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar11,&local_6e0);
      __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
    }
  }
  sVar4 = strftime(local_4b8,0x80,"%F %T",&local_4f0);
  if (sVar4 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_668,"strftime failed: \'",0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_668,"\' error: ",9);
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<((ostream *)&local_668,pcVar10);
    pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar11,&local_6e0);
    __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
  }
  pFVar6 = (FILE *)this->m_fp;
  psVar7 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  uVar3 = getpid();
  iVar2 = fprintf(pFVar6,"%s - %s [PID: %d] - %s\n",local_4b8,pcVar1,(ulong)uVar3,
                  (str->_M_dataplus)._M_p);
  if (iVar2 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_668,"failed to write to file \'",0x19);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_668,(this->m_fname)._M_dataplus._M_p,
                        (this->m_fname)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' error:",8);
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    std::operator<<(poVar8,pcVar10);
    pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    LogException::LogException(pLVar11,&local_6e0);
    __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
  }
  iVar2 = fflush((FILE *)this->m_fp);
  if (-1 < iVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
      operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_668,"failed to fflush to file \'",0x1a);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_668,(this->m_fname)._M_dataplus._M_p,
                      (this->m_fname)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' error:",8);
  piVar9 = __errno_location();
  pcVar10 = strerror(*piVar9);
  std::operator<<(poVar8,pcVar10);
  pLVar11 = (LogException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  LogException::LogException(pLVar11,&local_6e0);
  __cxa_throw(pLVar11,&LogException::typeinfo,LogException::~LogException);
}

Assistant:

void LogFileDaily::Log(const LogType Type, const std::string &str)
{
	time_t current = time(NULL);
	struct tm timeinfo;
	char fname[1024];
	char buf[128];

	localtime_r(&current, &timeinfo);

	if (strftime(fname, sizeof(fname), "%Y%m%d", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}
	const std::string cname = m_dir + "/" + m_prefix + "-" + fname;

	if (m_fname != cname)
	{
		if (m_fp != NULL)
		{
			if (fclose(m_fp) < 0)
			{
				std::stringstream ss;
				ss << "Cannot close file: '" << m_fname << "' error: " << strerror(errno);
				throw(LogException(ss.str()));
			}
			m_fp = NULL;
		}
		m_fname = cname;
		RemoveOld();
	}

	if (m_fp == NULL)
	{
		m_fp = fopen(m_fname.c_str(), "a");
		if (m_fp == NULL)
		{
			std::stringstream ss;
			ss << "Cannot open file: '" << m_fname << "' error: " << strerror(errno);
			throw(LogException(ss.str()));
		}
	}

	if (strftime(buf, sizeof(buf), "%F %T", &timeinfo) == 0)
	{
		std::stringstream ss;
		ss << "strftime failed: '" << "' error: " << strerror(errno);
		throw(LogException(ss.str()));
	}

	if (fprintf(m_fp, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "failed to write to file '" << m_fname << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
	if (fflush(m_fp) < 0)
	{
		std::stringstream ss;
		ss << "failed to fflush to file '" << m_fname << "' error:" << strerror(errno);
		throw(LogException(ss.str()));
	}
}